

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<google::protobuf::UnknownField>::ExtractSubrange
          (RepeatedField<google::protobuf::UnknownField> *this,int start,int num,
          UnknownField *elements)

{
  uint uVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  
  if (start < 0) {
    ExtractSubrange();
  }
  else if (-1 < num) {
    uVar6 = (this->soo_rep_).field_0.long_rep.elements_int;
    iVar4 = internal::SooRep::size(&this->soo_rep_,(uVar6 & 4) == 0);
    uVar1 = num + start;
    if ((int)uVar1 <= iVar4) {
      if ((uVar6 & 4) == 0) {
        pcVar5 = (char *)((long)&(this->soo_rep_).field_0 + 8);
      }
      else {
        pcVar5 = internal::LongSooRep::elements((LongSooRep *)this);
      }
      if (num != 0 && elements != (UnknownField *)0x0) {
        lVar7 = 0;
        do {
          uVar3 = *(undefined8 *)(pcVar5 + lVar7 + (ulong)(uint)start * 0x10 + 8);
          puVar2 = (undefined8 *)((long)&elements->number_ + lVar7);
          *puVar2 = *(undefined8 *)(pcVar5 + lVar7 + (ulong)(uint)start * 0x10);
          puVar2[1] = uVar3;
          lVar7 = lVar7 + 0x10;
        } while ((ulong)(uint)num << 4 != lVar7);
      }
      if (num != 0) {
        if ((int)uVar1 < iVar4) {
          uVar6 = (ulong)uVar1;
          pcVar5 = pcVar5 + uVar6 * 0x10;
          do {
            uVar3 = *(undefined8 *)(pcVar5 + 8);
            *(undefined8 *)(pcVar5 + (ulong)(uint)num * -0x10) = *(undefined8 *)pcVar5;
            *(undefined8 *)(pcVar5 + (ulong)(uint)num * -0x10 + 8) = uVar3;
            uVar6 = uVar6 + 1;
            pcVar5 = pcVar5 + 0x10;
          } while ((long)uVar6 < (long)iVar4);
        }
        Truncate(this,iVar4 - num);
        return;
      }
      return;
    }
    goto LAB_002619cd;
  }
  ExtractSubrange();
LAB_002619cd:
  ExtractSubrange();
}

Assistant:

void RepeatedField<Element>::ExtractSubrange(int start, int num,
                                             Element* elements) {
  ABSL_DCHECK_GE(start, 0);
  ABSL_DCHECK_GE(num, 0);
  const bool is_soo = this->is_soo();
  const int old_size = size(is_soo);
  ABSL_DCHECK_LE(start + num, old_size);
  Element* elem = unsafe_elements(is_soo);

  // Save the values of the removed elements if requested.
  if (elements != nullptr) {
    for (int i = 0; i < num; ++i) elements[i] = std::move(elem[i + start]);
  }

  // Slide remaining elements down to fill the gap.
  if (num > 0) {
    for (int i = start + num; i < old_size; ++i)
      elem[i - num] = std::move(elem[i]);
    Truncate(old_size - num);
  }
}